

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O1

void __thiscall senjo::UCIAdapter::IsReadyCommand(UCIAdapter *this,char *params)

{
  size_t sVar1;
  int iVar2;
  Output local_20;
  
  sVar1 = DAT_001b6788;
  if (params != (char *)0x0 && DAT_001b6788 != 0) {
    iVar2 = strncmp(params,token::Help_abi_cxx11_,DAT_001b6788);
    if (iVar2 == 0) {
      if (params[sVar1] != '\0') {
        iVar2 = isspace((int)params[sVar1]);
        if (iVar2 == 0) goto LAB_001344bc;
      }
      Output::Output(&local_20,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,token::IsReady_abi_cxx11_,DAT_001b67a8);
      Output::~Output(&local_20);
      Output::Output(&local_20,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Output readyok when engine is ready to receive input.",0x35)
      ;
      goto LAB_001344f8;
    }
  }
LAB_001344bc:
  iVar2 = (*this->engine->_vptr_ChessEngine[8])();
  if ((char)iVar2 == '\0') {
    (*this->engine->_vptr_ChessEngine[7])();
  }
  Output::Output(&local_20,NoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"readyok",7);
LAB_001344f8:
  Output::~Output(&local_20);
  return;
}

Assistant:

void UCIAdapter::IsReadyCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::IsReady;
    Output() << "Output readyok when engine is ready to receive input.";
    return;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
  }
  Output(Output::NoPrefix) << "readyok";
}